

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O3

int zt_ptr_array_del(zt_ptr_array *array,void *data)

{
  void **ppvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((data != (void *)0x0 && array != (zt_ptr_array *)0x0) && (iVar2 = array->count, 0 < iVar2)) {
    lVar4 = 0;
    do {
      ppvVar1 = array->array;
      if (ppvVar1[lVar4] == data) {
        lVar3 = (long)iVar2;
        iVar2 = iVar2 + -1;
        ppvVar1[lVar4] = ppvVar1[lVar3 + -1];
        array->count = iVar2;
        if (array->free_cb != (zt_ptr_array_free_cb)0x0) {
          (*array->free_cb)(data);
          iVar2 = array->count;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return -1;
}

Assistant:

int
zt_ptr_array_del(zt_ptr_array * array, void * data) {
    int32_t i;

    if (array == NULL || data == NULL) {
        return -1;
    }

    for (i = 0; i < array->count; i++) {
        if (array->array[i] == data) {
            zt_ptr_array_move_idx_to_idx(array, array->count - 1, i);
            array->count--;

            if (array->free_cb) {
                array->free_cb(data);
            }
        }
    }

    return -1;
}